

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

int fromOffsetString(QStringView offsetString,bool *valid)

{
  storage_type_conflict sVar1;
  QString *pQVar2;
  qlonglong qVar3;
  qlonglong qVar4;
  int iVar5;
  int iVar6;
  QString *this;
  int in_R8D;
  undefined1 *puVar7;
  long in_FS_OFFSET;
  QStringView string;
  QStringView string_00;
  bool ok;
  byte local_49;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *valid = false;
  iVar6 = 0;
  if (0xfffffffffffffffa < offsetString.m_size - 7U) {
    sVar1 = *offsetString.m_data;
    if (sVar1 == L'+') {
      iVar5 = 0x3c;
    }
    else {
      iVar6 = 0;
      if (sVar1 != L'-') goto LAB_0034bd27;
      iVar5 = -0x3c;
    }
    local_48.m_data = offsetString.m_data + 1;
    local_48.m_size = offsetString.m_size + -1;
    iVar6 = 0;
    pQVar2 = (QString *)QStringView::indexOf(&local_48,(QChar)0x3a,0,CaseSensitive);
    puVar7 = (undefined1 *)((long)&(pQVar2->d).d + 1);
    if (puVar7 == (undefined1 *)0x0) {
      pQVar2 = (QString *)0x2;
      puVar7 = (undefined1 *)0x2;
    }
    this = (QString *)local_48.m_size;
    if ((long)pQVar2 < local_48.m_size) {
      this = pQVar2;
    }
    local_49 = 0;
    string.m_data = (storage_type_conflict *)&local_49;
    string.m_size = (qsizetype)local_48.m_data;
    qVar3 = QString::toIntegral_helper(this,string,(bool *)0xa,in_R8D);
    if (((int)qVar3 == qVar3) && (qVar3 < 0x18 && (~local_49 & 1) == 0)) {
      iVar6 = 0;
      qVar4 = 0;
      if ((((QString *)(local_48.m_size - (long)puVar7) == (QString *)0x0 ||
            local_48.m_size < (long)puVar7) ||
          (string_00.m_data = (storage_type_conflict *)&local_49,
          string_00.m_size = (qsizetype)(local_48.m_data + (long)puVar7),
          qVar4 = QString::toIntegral_helper
                            ((QString *)(local_48.m_size - (long)puVar7),string_00,(bool *)0xa,
                             in_R8D), (int)qVar4 == qVar4)) &&
         (((uint)qVar4 < 0x3c && ((local_49 & 1) != 0)))) {
        *valid = true;
        iVar6 = iVar5 * ((uint)qVar4 + (int)qVar3 * 0x3c);
      }
    }
  }
LAB_0034bd27:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

static int fromOffsetString(QStringView offsetString, bool *valid) noexcept
{
    *valid = false;

    const qsizetype size = offsetString.size();
    if (size < 2 || size > 6)
        return 0;

    // sign will be +1 for a positive and -1 for a negative offset
    int sign;

    // First char must be + or -
    const QChar signChar = offsetString[0];
    if (signChar == u'+')
        sign = 1;
    else if (signChar == u'-')
        sign = -1;
    else
        return 0;

    // Split the hour and minute parts
    const QStringView time = offsetString.sliced(1);
    qsizetype hhLen = time.indexOf(u':');
    qsizetype mmIndex;
    if (hhLen == -1)
        mmIndex = hhLen = 2; // ±HHmm or ±HH format
    else
        mmIndex = hhLen + 1;

    const QStringView hhRef = time.first(qMin(hhLen, time.size()));
    bool ok = false;
    const int hour = hhRef.toInt(&ok);
    if (!ok || hour > 23) // More generous than QTimeZone::MaxUtcOffsetSecs
        return 0;

    const QStringView mmRef = time.sliced(qMin(mmIndex, time.size()));
    const int minute = mmRef.isEmpty() ? 0 : mmRef.toInt(&ok);
    if (!ok || minute < 0 || minute > 59)
        return 0;

    *valid = true;
    return sign * ((hour * 60) + minute) * 60;
}